

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CfgNode.cpp
# Opt level: O2

void __thiscall CfgNode::BlockData::~BlockData(BlockData *this)

{
  ~BlockData(this);
  operator_delete(this);
  return;
}

Assistant:

CfgNode::BlockData::~BlockData() {
	for (std::map<Addr, CfgCall*>::iterator it = m_calls.begin(),
			ed = m_calls.end(); it != ed; it++) {
		delete it->second;
	}

	for (std::map<int, CfgSignalHandler*>::iterator it = m_signalHandlers.begin(),
			ed = m_signalHandlers.end(); it != ed; it++) {
		delete it->second;
	}
}